

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_linenum_formatter<spdlog::details::null_scoped_padder>::format
          (source_linenum_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_3,memory_buf_t *dest)

{
  bool bVar1;
  memory_buf_t *in_RCX;
  long in_RSI;
  memory_buf_t *in_RDI;
  int unaff_retaddr;
  null_scoped_padder p;
  uint field_size;
  null_scoped_padder p_1;
  null_scoped_padder local_29;
  uint local_28;
  null_scoped_padder local_21;
  memory_buf_t *local_20;
  long local_10;
  memory_buf_t *dest_00;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  dest_00 = in_RDI;
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    null_scoped_padder::null_scoped_padder
              (&local_21,0,(padding_info *)&(in_RDI->super_buffer<char>).ptr_,local_20);
  }
  else {
    local_28 = null_scoped_padder::count_digits<int>(*(int *)(local_10 + 0x40));
    null_scoped_padder::null_scoped_padder
              (&local_29,(ulong)local_28,(padding_info *)&(in_RDI->super_buffer<char>).ptr_,local_20
              );
    fmt_helper::append_int<int>(unaff_retaddr,dest_00);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }

        auto field_size = ScopedPadder::count_digits(msg.source.line);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.source.line, dest);
    }